

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O1

double __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
compute_scalar_product
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                 *second)

{
  undefined4 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer pvVar6;
  pointer pvVar7;
  long lVar8;
  pointer ppVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  int local_78;
  pair<double,_double> local_50;
  pair<double,_double> local_40;
  
  if (this->discrete == true) {
    pvVar6 = (this->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (second->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((((long)(this->heat_map).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 !=
           (long)(second->heat_map).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) ||
         (this->min_ != second->min_)) || (NAN(this->min_) || NAN(second->min_))) ||
       ((this->max_ != second->max_ || (NAN(this->max_) || NAN(second->max_))))) {
LAB_00104f88:
      std::operator<<((ostream *)&std::cerr,
                      "The persistence images are of non compatible sizes. We cannot therefore compute distance between them. The program will now terminate"
                     );
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = 
      "The persistence images are of non compatible sizes. The program will now terminate";
      __cxa_throw(puVar10,&char_const*::typeinfo,0);
    }
    lVar13 = (long)(this->heat_map).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6;
    if (lVar13 != 0) {
      dVar20 = 0.0;
      lVar14 = 0;
      do {
        lVar8 = *(long *)&pvVar6[lVar14].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        lVar16 = (long)*(pointer *)
                        ((long)&pvVar6[lVar14].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) - lVar8;
        if (lVar16 != 0) {
          lVar17 = 0;
          do {
            dVar20 = dVar20 + *(double *)(lVar8 + lVar17 * 8) *
                              *(double *)
                               (*(long *)&pvVar7[lVar14].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + lVar17 * 8);
            lVar17 = lVar17 + 1;
          } while (lVar16 >> 3 != lVar17);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != (lVar13 >> 3) * -0x5555555555555555);
      return dVar20;
    }
  }
  else {
    uVar11 = (ulong)((long)(this->interval).
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->interval).
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    if (0 < (int)uVar11) {
      uVar15 = (ulong)((long)(second->interval).
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(second->interval).
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4;
      dVar20 = 0.0;
      uVar12 = 0;
      do {
        local_78 = (int)uVar15;
        if (0 < local_78) {
          ppVar9 = (this->interval).
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          dVar2 = ppVar9[uVar12].first;
          dVar3 = ppVar9[uVar12].second;
          lVar13 = 0;
          uVar18 = uVar15 & 0x7fffffff;
          do {
            puVar1 = (undefined4 *)
                     ((long)&((second->interval).
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first + lVar13 * 2);
            local_40.first._0_4_ = *puVar1;
            local_40.first._4_4_ = puVar1[1];
            local_40.second._0_4_ = puVar1[2];
            local_40.second._4_4_ = puVar1[3];
            dVar4 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12];
            dVar5 = *(double *)
                     ((long)(second->weights).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar13);
            local_50.first = dVar2;
            local_50.second = dVar3;
            if ((this->kernel).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
              goto LAB_00104f88;
            }
            dVar19 = (*(this->kernel)._M_invoker)((_Any_data *)&this->kernel,&local_50,&local_40);
            dVar20 = dVar20 + dVar19 * dVar4 * dVar5;
            lVar13 = lVar13 + 8;
            uVar18 = uVar18 - 1;
          } while (uVar18 != 0);
        }
        uVar12 = uVar12 + 1;
        if (uVar12 == (uVar11 & 0x7fffffff)) {
          return dVar20;
        }
      } while( true );
    }
  }
  return 0.0;
}

Assistant:

double Persistence_heat_maps<Scalling_of_kernels>::compute_scalar_product(const Persistence_heat_maps& second) const {
  if (discrete) {
    // first we need to check if (*this) and second are defined on the same domain and have the same dimensions:
    if (!this->check_if_the_same(second)) {
      std::cerr << "The persistence images are of non compatible sizes. We cannot therefore compute distance between "
                   "them. The program will now terminate";
      throw "The persistence images are of non compatible sizes. The program will now terminate";
    }

    // if we are here, we know that the two persistence images are defined on the same domain, so we can start computing
    // their scalar product:
    double scalar_prod = 0;
    for (size_t i = 0; i != this->heat_map.size(); ++i) {
      for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
        scalar_prod += this->heat_map[i][j] * second.heat_map[i][j];
      }
    }
    return scalar_prod;
  } else {
    int num_pts1 = this->interval.size();
    int num_pts2 = second.interval.size();
    double kernel_val = 0;
    for (int i = 0; i < num_pts1; i++) {
      std::pair<double, double> pi = this->interval[i];
      for (int j = 0; j < num_pts2; j++) {
        std::pair<double, double> pj = second.interval[j];
        kernel_val += this->weights[i] * second.weights[j] * this->kernel(pi, pj);
      }
    }
    return kernel_val;
  }
}